

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rkvstore_create_instance.cc
# Opt level: O3

int __thiscall
aliyun::Rkvstore::CreateInstance
          (Rkvstore *this,RkvstoreCreateInstanceRequestType *req,
          RkvstoreCreateInstanceResponseType *response,RkvstoreErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  size_type *psVar11;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_5e0;
  Value local_5c0;
  allocator<char> local_5a1;
  long *local_5a0;
  long local_598;
  long local_590 [2];
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580._M_string_length = 0;
  local_580.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_5a0 = local_590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,this->secret_,&local_5a1);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_5a0,local_598 + (long)local_5a0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_560.field_2._M_allocated_capacity = *psVar11;
    local_560.field_2._8_8_ = plVar8[3];
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  }
  else {
    local_560.field_2._M_allocated_capacity = *psVar11;
    local_560._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_560._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_560);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_5c0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"CreateInstance","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar3 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar3 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar3,pcVar3 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar3 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar3,pcVar3 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"OwnerAccount","");
    pcVar3 = (req->owner_account)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar3,pcVar3 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_name)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"InstanceName","");
    pcVar3 = (req->instance_name)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar3,pcVar3 + (req->instance_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->password)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Password","");
    pcVar3 = (req->password)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar3,pcVar3 + (req->password)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->capacity)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Capacity","");
    pcVar3 = (req->capacity)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar3,pcVar3 + (req->capacity)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->zone_id)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"ZoneId","");
    pcVar3 = (req->zone_id)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar3,pcVar3 + (req->zone_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->config)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Config","");
    pcVar3 = (req->config)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar3,pcVar3 + (req->config)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->charge_type)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ChargeType","");
    pcVar3 = (req->charge_type)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar3,pcVar3 + (req->charge_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->period)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"Period","");
    pcVar3 = (req->period)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar3,pcVar3 + (req->period)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->token)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"Token","");
    pcVar3 = (req->token)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar3,pcVar3 + (req->token)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_5e0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_580);
    if ((0 < iVar5) && (local_580._M_string_length != 0)) {
      bVar4 = Json::Reader::parse(&local_140,&local_580,&local_5c0,true);
      if (bVar4) {
        if (error_info != (RkvstoreErrorInfo *)0x0 && iVar5 != 200) {
          bVar4 = Json::Value::isMember(&local_5c0,"RequestId");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
          }
          else {
            local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e0,anon_var_dwarf_1ac39e + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_5e0);
          paVar1 = &local_5e0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Code");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Code");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
          }
          else {
            local_5e0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e0,anon_var_dwarf_1ac39e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_5e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_5c0,"HostId");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"HostId");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
          }
          else {
            local_5e0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e0,anon_var_dwarf_1ac39e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_5e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Message");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Message");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
          }
          else {
            local_5e0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e0,anon_var_dwarf_1ac39e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_5e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          }
        }
        if (response != (RkvstoreCreateInstanceResponseType *)0x0 && iVar5 == 200) {
          bVar4 = Json::Value::isMember(&local_5c0,"InstanceId");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"InstanceId");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)response,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"InstanceName");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"InstanceName");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->instance_name,(string *)&local_5e0)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"ConnectionDomain");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"ConnectionDomain");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)&response->connection_domain,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Port");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Port");
            IVar6 = Json::Value::asInt(pVVar10);
            response->port = IVar6;
          }
          bVar4 = Json::Value::isMember(&local_5c0,"UserName");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"UserName");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->user_name,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"InstanceStatus");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"InstanceStatus");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)&response->instance_status,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"RegionId");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"RegionId");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->region_id,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Capacity");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Capacity");
            IVar6 = Json::Value::asInt(pVVar10);
            response->capacity = (long)IVar6;
          }
          bVar4 = Json::Value::isMember(&local_5c0,"QPS");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"QPS");
            IVar6 = Json::Value::asInt(pVVar10);
            response->qp_s = (long)IVar6;
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Bandwidth");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Bandwidth");
            IVar6 = Json::Value::asInt(pVVar10);
            response->bandwidth = (long)IVar6;
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Connections");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Connections");
            IVar6 = Json::Value::asInt(pVVar10);
            response->connections = (long)IVar6;
          }
          bVar4 = Json::Value::isMember(&local_5c0,"ZoneId");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"ZoneId");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->zone_id,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"Config");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"Config");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->config,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"ChargeType");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"ChargeType");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->charge_type,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_5c0,"EndTime");
          iVar5 = 200;
          if (bVar4) {
            pVVar10 = Json::Value::operator[](&local_5c0,"EndTime");
            Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
            std::__cxx11::string::operator=((string *)&response->end_time,(string *)&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
              operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        goto LAB_0012892b;
      }
    }
    if (error_info == (RkvstoreErrorInfo *)0x0) goto LAB_00128926;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (RkvstoreErrorInfo *)0x0) {
LAB_00128926:
      iVar5 = -1;
      goto LAB_0012892b;
    }
    pcVar7 = "connect to host failed";
  }
  iVar5 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0012892b:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_5c0);
  if (local_5a0 != local_590) {
    operator_delete(local_5a0,local_590[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,
                    CONCAT71(local_580.field_2._M_allocated_capacity._1_7_,
                             local_580.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Rkvstore::CreateInstance(const RkvstoreCreateInstanceRequestType& req,
                      RkvstoreCreateInstanceResponseType* response,
                       RkvstoreErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreateInstance");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(!req.instance_name.empty()) {
    req_rpc->AddRequestQuery("InstanceName", req.instance_name);
  }
  if(!req.password.empty()) {
    req_rpc->AddRequestQuery("Password", req.password);
  }
  if(!req.capacity.empty()) {
    req_rpc->AddRequestQuery("Capacity", req.capacity);
  }
  if(!req.zone_id.empty()) {
    req_rpc->AddRequestQuery("ZoneId", req.zone_id);
  }
  if(!req.config.empty()) {
    req_rpc->AddRequestQuery("Config", req.config);
  }
  if(!req.charge_type.empty()) {
    req_rpc->AddRequestQuery("ChargeType", req.charge_type);
  }
  if(!req.period.empty()) {
    req_rpc->AddRequestQuery("Period", req.period);
  }
  if(!req.token.empty()) {
    req_rpc->AddRequestQuery("Token", req.token);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}